

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O3

void __thiscall QEGLPlatformContext::updateFormatFromGL(QEGLPlatformContext *this)

{
  QSurfaceFormat *this_00;
  bool bVar1;
  int iVar2;
  RenderableType RVar3;
  EGLDisplay pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  EGLConfig pvVar9;
  long lVar10;
  char *pcVar11;
  pair<int,_int> pVar12;
  OpenGLContextProfile profile;
  long in_FS_OFFSET;
  int minor;
  int major;
  GLint value;
  int local_60;
  int local_5c;
  QByteArray local_58;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar4 = (EGLDisplay)eglGetCurrentDisplay();
  if (pvVar4 == (EGLDisplay)0x0) {
    pvVar4 = this->m_eglDisplay;
  }
  uVar5 = eglGetCurrentContext();
  uVar6 = eglGetCurrentSurface(0x3059);
  uVar7 = eglGetCurrentSurface(0x305a);
  if ((((this->m_flags).super_QFlagsStorageHelper<QEGLPlatformContext::Flag,_4>.
        super_QFlagsStorage<QEGLPlatformContext::Flag>.i & 1) == 0) &&
     (bVar1 = q_hasEglExtension(this->m_eglDisplay,"EGL_KHR_surfaceless_context"), bVar1)) {
    lVar8 = 0;
  }
  else {
    iVar2 = (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x12])(this);
    lVar8 = CONCAT44(extraout_var,iVar2);
  }
  iVar2 = eglMakeCurrent(this->m_eglDisplay,lVar8,lVar8,this->m_eglContext);
  if (iVar2 == 0) {
    pvVar9 = q_configFromGLFormat(this->m_eglDisplay,&this->m_format,false,1);
    lVar10 = eglCreateContext(this->m_eglDisplay,pvVar9,0,(this->m_contextAttrs).d.ptr);
    if ((lVar10 == 0) || (iVar2 = eglMakeCurrent(this->m_eglDisplay,lVar8,lVar8,lVar10), iVar2 == 0)
       ) {
      updateFormatFromGL();
      goto LAB_0060a490;
    }
  }
  else {
    lVar10 = 0;
  }
  this_00 = &this->m_format;
  RVar3 = QSurfaceFormat::renderableType(this_00);
  if ((RVar3 == OpenGL) || (RVar3 = QSurfaceFormat::renderableType(this_00), RVar3 == OpenGLES)) {
    pcVar11 = (char *)glGetString(0x1f02);
    if (pcVar11 != (char *)0x0) {
      local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(&local_58,pcVar11,-1);
      local_5c = -0x55555556;
      local_60 = -0x55555556;
      bVar1 = QPlatformOpenGLContext::parseOpenGLVersion(&local_58,&local_5c,&local_60);
      if (bVar1) {
        QSurfaceFormat::setMajorVersion(this_00,local_5c);
        QSurfaceFormat::setMinorVersion(this_00,local_60);
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
    QSurfaceFormat::setProfile(this_00,NoProfile);
    QSurfaceFormat::setOptions(this_00,(FormatOptions)0x0);
    RVar3 = QSurfaceFormat::renderableType(this_00);
    if (RVar3 == OpenGL) {
      iVar2 = QSurfaceFormat::majorVersion(this_00);
      if (iVar2 < 3) {
        QSurfaceFormat::setOption(this_00,DeprecatedFunctions,true);
      }
      else {
        local_58.d.d = (Data *)((ulong)local_58.d.d & 0xffffffff00000000);
        glGetIntegerv(0x821e,&local_58);
        if (((ulong)local_58.d.d & 1) == 0) {
          QSurfaceFormat::setOption(this_00,DeprecatedFunctions,true);
        }
        if (((uint)local_58.d.d & 2) != 0) {
          QSurfaceFormat::setOption(this_00,DebugContext,true);
        }
        pVar12 = QSurfaceFormat::version(this_00);
        if ((2 < pVar12.first) && (pVar12.first != 3 || 1 < pVar12.second)) {
          local_58.d.d = (Data *)((ulong)local_58.d.d & 0xffffffff00000000);
          glGetIntegerv(0x9126,&local_58);
          profile = CoreProfile;
          if ((((ulong)local_58.d.d & 1) != 0) ||
             (profile = CompatibilityProfile, ((ulong)local_58.d.d & 2) != 0)) {
            QSurfaceFormat::setProfile(this_00,profile);
          }
        }
      }
    }
  }
  (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x14])(this);
  eglMakeCurrent(pvVar4,uVar6,uVar7,uVar5);
LAB_0060a490:
  if (lVar8 != 0) {
    (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x13])(this,lVar8);
  }
  if (lVar10 != 0) {
    eglDestroyContext(this->m_eglDisplay,lVar10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEGLPlatformContext::updateFormatFromGL()
{
#ifndef QT_NO_OPENGL
    // Have to save & restore to prevent QOpenGLContext::currentContext() from becoming
    // inconsistent after QOpenGLContext::create().
    EGLDisplay prevDisplay = eglGetCurrentDisplay();
    if (prevDisplay == EGL_NO_DISPLAY) // when no context is current
        prevDisplay = m_eglDisplay;
    EGLContext prevContext = eglGetCurrentContext();
    EGLSurface prevSurfaceDraw = eglGetCurrentSurface(EGL_DRAW);
    EGLSurface prevSurfaceRead = eglGetCurrentSurface(EGL_READ);

    // Rely on the surfaceless extension, if available. This is beneficial since we can
    // avoid creating an extra pbuffer surface which is apparently troublesome with some
    // drivers (Mesa) when certain attributes are present (multisampling).
    EGLSurface tempSurface = EGL_NO_SURFACE;
    EGLContext tempContext = EGL_NO_CONTEXT;
    if (m_flags.testFlag(NoSurfaceless) || !q_hasEglExtension(m_eglDisplay, "EGL_KHR_surfaceless_context"))
        tempSurface = createTemporaryOffscreenSurface();

    EGLBoolean ok = eglMakeCurrent(m_eglDisplay, tempSurface, tempSurface, m_eglContext);
    if (!ok) {
        EGLConfig config = q_configFromGLFormat(m_eglDisplay, m_format, false, EGL_PBUFFER_BIT);
        tempContext = eglCreateContext(m_eglDisplay, config, nullptr, m_contextAttrs.constData());
        if (tempContext != EGL_NO_CONTEXT)
            ok = eglMakeCurrent(m_eglDisplay, tempSurface, tempSurface, tempContext);
    }
    if (ok) {
        if (m_format.renderableType() == QSurfaceFormat::OpenGL
            || m_format.renderableType() == QSurfaceFormat::OpenGLES) {
            const GLubyte *s = glGetString(GL_VERSION);
            if (s) {
                QByteArray version = QByteArray(reinterpret_cast<const char *>(s));
                int major, minor;
                if (QPlatformOpenGLContext::parseOpenGLVersion(version, major, minor)) {
                    m_format.setMajorVersion(major);
                    m_format.setMinorVersion(minor);
                }
            }
            m_format.setProfile(QSurfaceFormat::NoProfile);
            m_format.setOptions(QSurfaceFormat::FormatOptions());
            if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
                // Check profile and options.
                if (m_format.majorVersion() < 3) {
                    m_format.setOption(QSurfaceFormat::DeprecatedFunctions);
                } else {
                    GLint value = 0;
                    glGetIntegerv(GL_CONTEXT_FLAGS, &value);
                    if (!(value & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT))
                        m_format.setOption(QSurfaceFormat::DeprecatedFunctions);
                    if (value & GL_CONTEXT_FLAG_DEBUG_BIT)
                        m_format.setOption(QSurfaceFormat::DebugContext);
                    if (m_format.version() >= std::pair(3, 2)) {
                        value = 0;
                        glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &value);
                        if (value & GL_CONTEXT_CORE_PROFILE_BIT)
                            m_format.setProfile(QSurfaceFormat::CoreProfile);
                        else if (value & GL_CONTEXT_COMPATIBILITY_PROFILE_BIT)
                            m_format.setProfile(QSurfaceFormat::CompatibilityProfile);
                    }
                }
            }
        }
        runGLChecks();
        eglMakeCurrent(prevDisplay, prevSurfaceDraw, prevSurfaceRead, prevContext);
    } else {
        qWarning("QEGLPlatformContext: Failed to make temporary surface current, format not updated (%x)", eglGetError());
    }
    if (tempSurface != EGL_NO_SURFACE)
        destroyTemporaryOffscreenSurface(tempSurface);
    if (tempContext != EGL_NO_CONTEXT)
        eglDestroyContext(m_eglDisplay, tempContext);
#endif // QT_NO_OPENGL
}